

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O1

void __thiscall
UnitTests::Assert::
RangeEquals<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,_List_iterator<long> expected_first,
          _List_iterator<long> expected_last,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last)

{
  _List_node_base **pp_Var1;
  _List_iterator<long> _Var2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  long got_len;
  long expected_len;
  string local_58;
  Assert *local_38;
  
  expected_len = 0;
  _Var2._M_node = expected_first._M_node;
  if (expected_first._M_node != expected_last._M_node) {
    do {
      pp_Var1 = &(_Var2._M_node)->_M_next;
      expected_len = expected_len + 1;
      _Var2._M_node = *pp_Var1;
    } while (*pp_Var1 != expected_last._M_node);
  }
  got_len = (long)got_last._M_current - (long)got_first._M_current >> 2;
  if (expected_len != got_len) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58," length","");
    RangeError<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (this,msg,&local_58,expected_first,expected_last,got_first,got_last,expected_last,
               expected_len,got_len);
  }
  _Var3._M_current = got_first._M_current;
  _Var2._M_node = expected_first._M_node;
  if (expected_first._M_node != expected_last._M_node) {
    do {
      if (_Var2._M_node[1]._M_next != (_List_node_base *)(long)*_Var3._M_current) break;
      _Var2._M_node = (_Var2._M_node)->_M_next;
      _Var3._M_current = _Var3._M_current + 1;
    } while (_Var2._M_node != expected_last._M_node);
  }
  if (_Var2._M_node != expected_last._M_node) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_38 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    RangeError<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_38,msg,&local_58,expected_first,expected_last,got_first,got_last,_Var2,
               expected_len,got_len);
  }
  return;
}

Assistant:

void RangeEquals(const std::string& msg, ExpectedIt expected_first, ExpectedIt expected_last,
            GotIterator got_first, GotIterator got_last) const
        {
            auto expected_len = std::distance(expected_first, expected_last);
            auto got_len      = std::distance(got_first, got_last);
            if (expected_len != got_len)
            {
                RangeError(msg, " length", expected_first, expected_last, got_first, got_last, expected_last,
                    expected_len, got_len);
            }

            auto dif = std::mismatch(expected_first, expected_last, got_first).first;
            if (dif != expected_last)
            {
                RangeError(msg, "", expected_first, expected_last, got_first, got_last, dif, expected_len, got_len);
            }
        }